

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eodata.cpp
# Opt level: O0

void pub_read_record(EIF_Data *newdata,char *buf)

{
  bool bVar1;
  uint uVar2;
  Type TVar3;
  SubType SVar4;
  Special SVar5;
  Size SVar6;
  char *buf_local;
  EIF_Data *newdata_local;
  
  uVar2 = PacketProcessor::Number(*buf,buf[1],0xfe,0xfe);
  newdata->graphic = (short)uVar2;
  TVar3 = PacketProcessor::Number(buf[2],0xfe,0xfe,0xfe);
  newdata->type = TVar3;
  SVar4 = PacketProcessor::Number(buf[3],0xfe,0xfe,0xfe);
  newdata->subtype = SVar4;
  if ((newdata->id == 0x16d) && (bVar1 = std::operator==(&newdata->name,"Gun"), bVar1)) {
    newdata->subtype = Ranged;
  }
  SVar5 = PacketProcessor::Number(buf[4],0xfe,0xfe,0xfe);
  newdata->special = SVar5;
  uVar2 = PacketProcessor::Number(buf[5],buf[6],0xfe,0xfe);
  newdata->hp = (short)uVar2;
  uVar2 = PacketProcessor::Number(buf[7],buf[8],0xfe,0xfe);
  newdata->tp = (short)uVar2;
  uVar2 = PacketProcessor::Number(buf[9],buf[10],0xfe,0xfe);
  newdata->mindam = (short)uVar2;
  uVar2 = PacketProcessor::Number(buf[0xb],buf[0xc],0xfe,0xfe);
  newdata->maxdam = (short)uVar2;
  uVar2 = PacketProcessor::Number(buf[0xd],buf[0xe],0xfe,0xfe);
  newdata->accuracy = (short)uVar2;
  uVar2 = PacketProcessor::Number(buf[0xf],buf[0x10],0xfe,0xfe);
  newdata->evade = (short)uVar2;
  uVar2 = PacketProcessor::Number(buf[0x11],buf[0x12],0xfe,0xfe);
  newdata->armor = (short)uVar2;
  uVar2 = PacketProcessor::Number(buf[0x14],0xfe,0xfe,0xfe);
  newdata->str = (uchar)uVar2;
  uVar2 = PacketProcessor::Number(buf[0x15],0xfe,0xfe,0xfe);
  newdata->intl = (uchar)uVar2;
  uVar2 = PacketProcessor::Number(buf[0x16],0xfe,0xfe,0xfe);
  newdata->wis = (uchar)uVar2;
  uVar2 = PacketProcessor::Number(buf[0x17],0xfe,0xfe,0xfe);
  newdata->agi = (uchar)uVar2;
  uVar2 = PacketProcessor::Number(buf[0x18],0xfe,0xfe,0xfe);
  newdata->con = (uchar)uVar2;
  uVar2 = PacketProcessor::Number(buf[0x19],0xfe,0xfe,0xfe);
  newdata->cha = (uchar)uVar2;
  uVar2 = PacketProcessor::Number(buf[0x1a],0xfe,0xfe,0xfe);
  newdata->light = (uchar)uVar2;
  uVar2 = PacketProcessor::Number(buf[0x1b],0xfe,0xfe,0xfe);
  newdata->dark = (uchar)uVar2;
  uVar2 = PacketProcessor::Number(buf[0x1c],0xfe,0xfe,0xfe);
  newdata->earth = (uchar)uVar2;
  uVar2 = PacketProcessor::Number(buf[0x1d],0xfe,0xfe,0xfe);
  newdata->air = (uchar)uVar2;
  uVar2 = PacketProcessor::Number(buf[0x1e],0xfe,0xfe,0xfe);
  newdata->water = (uchar)uVar2;
  uVar2 = PacketProcessor::Number(buf[0x1f],0xfe,0xfe,0xfe);
  newdata->fire = (uchar)uVar2;
  uVar2 = PacketProcessor::Number(buf[0x20],buf[0x21],buf[0x22],0xfe);
  (newdata->field_25).scrollmap = uVar2;
  uVar2 = PacketProcessor::Number(buf[0x23],0xfe,0xfe,0xfe);
  (newdata->field_26).gender = (uchar)uVar2;
  uVar2 = PacketProcessor::Number(buf[0x24],0xfe,0xfe,0xfe);
  (newdata->field_27).scrolly = (uchar)uVar2;
  uVar2 = PacketProcessor::Number(buf[0x25],buf[0x26],0xfe,0xfe);
  newdata->levelreq = (short)uVar2;
  uVar2 = PacketProcessor::Number(buf[0x27],buf[0x28],0xfe,0xfe);
  newdata->classreq = (short)uVar2;
  uVar2 = PacketProcessor::Number(buf[0x29],buf[0x2a],0xfe,0xfe);
  newdata->strreq = (short)uVar2;
  uVar2 = PacketProcessor::Number(buf[0x2b],buf[0x2c],0xfe,0xfe);
  newdata->intreq = (short)uVar2;
  uVar2 = PacketProcessor::Number(buf[0x2d],buf[0x2e],0xfe,0xfe);
  newdata->wisreq = (short)uVar2;
  uVar2 = PacketProcessor::Number(buf[0x2f],buf[0x30],0xfe,0xfe);
  newdata->agireq = (short)uVar2;
  uVar2 = PacketProcessor::Number(buf[0x31],buf[0x32],0xfe,0xfe);
  newdata->conreq = (short)uVar2;
  uVar2 = PacketProcessor::Number(buf[0x33],buf[0x34],0xfe,0xfe);
  newdata->chareq = (short)uVar2;
  uVar2 = PacketProcessor::Number(buf[0x37],0xfe,0xfe,0xfe);
  newdata->weight = (uchar)uVar2;
  SVar6 = PacketProcessor::Number(buf[0x39],0xfe,0xfe,0xfe);
  newdata->size = SVar6;
  return;
}

Assistant:

void pub_read_record(EIF_Data& newdata, char* buf)
{
	newdata.graphic = PacketProcessor::Number(buf[0], buf[1]);
	newdata.type = static_cast<EIF::Type>(PacketProcessor::Number(buf[2]));
	newdata.subtype = static_cast<EIF::SubType>(PacketProcessor::Number(buf[3]));
	// Ranged gun hack
	if (newdata.id == 365 && newdata.name == "Gun")
	{
		newdata.subtype = EIF::Ranged;
	}
	// / Ranged gun hack
	newdata.special = static_cast<EIF::Special>(PacketProcessor::Number(buf[4]));
	newdata.hp = PacketProcessor::Number(buf[5], buf[6]);
	newdata.tp = PacketProcessor::Number(buf[7], buf[8]);
	newdata.mindam = PacketProcessor::Number(buf[9], buf[10]);
	newdata.maxdam = PacketProcessor::Number(buf[11], buf[12]);
	newdata.accuracy = PacketProcessor::Number(buf[13], buf[14]);
	newdata.evade = PacketProcessor::Number(buf[15], buf[16]);
	newdata.armor = PacketProcessor::Number(buf[17], buf[18]);

	newdata.str = PacketProcessor::Number(buf[20]);
	newdata.intl = PacketProcessor::Number(buf[21]);
	newdata.wis = PacketProcessor::Number(buf[22]);
	newdata.agi = PacketProcessor::Number(buf[23]);
	newdata.con = PacketProcessor::Number(buf[24]);
	newdata.cha = PacketProcessor::Number(buf[25]);

	newdata.light = PacketProcessor::Number(buf[26]);
	newdata.dark = PacketProcessor::Number(buf[27]);
	newdata.earth = PacketProcessor::Number(buf[28]);
	newdata.air = PacketProcessor::Number(buf[29]);
	newdata.water = PacketProcessor::Number(buf[30]);
	newdata.fire = PacketProcessor::Number(buf[31]);

	newdata.scrollmap = PacketProcessor::Number(buf[32], buf[33], buf[34]);
	newdata.scrollx = PacketProcessor::Number(buf[35]);
	newdata.scrolly = PacketProcessor::Number(buf[36]);

	newdata.levelreq = PacketProcessor::Number(buf[37], buf[38]);
	newdata.classreq = PacketProcessor::Number(buf[39], buf[40]);

	newdata.strreq = PacketProcessor::Number(buf[41], buf[42]);
	newdata.intreq = PacketProcessor::Number(buf[43], buf[44]);
	newdata.wisreq = PacketProcessor::Number(buf[45], buf[46]);
	newdata.agireq = PacketProcessor::Number(buf[47], buf[48]);
	newdata.conreq = PacketProcessor::Number(buf[49], buf[50]);
	newdata.chareq = PacketProcessor::Number(buf[51], buf[52]);

	newdata.weight = PacketProcessor::Number(buf[55]);

	newdata.size = static_cast<EIF::Size>(PacketProcessor::Number(buf[57]));
}